

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_on_rehash
          (robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,size_t ibucket,distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          value_type *value)

{
  short sVar1;
  unsigned_long uVar2;
  short __tmp;
  short sVar3;
  bucket_entry *pbVar4;
  
  do {
    sVar1 = this->m_buckets[ibucket].m_dist_from_ideal_bucket;
    sVar3 = dist_from_ideal_bucket;
    if (sVar1 < dist_from_ideal_bucket) {
      pbVar4 = this->m_buckets + ibucket;
      if (sVar1 == -1) {
        std::pair<unsigned_long,_ImputedData<int,_double>_>::pair
                  ((pair<unsigned_long,_ImputedData<int,_double>_> *)pbVar4->m_value,value);
        pbVar4->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
        return;
      }
      uVar2 = value->first;
      value->first = *(unsigned_long *)pbVar4->m_value;
      *(unsigned_long *)pbVar4->m_value = uVar2;
      std::swap<ImputedData<int,double>>
                (&value->second,(ImputedData<int,_double> *)(pbVar4->m_value + 8));
      sVar3 = pbVar4->m_dist_from_ideal_bucket;
      pbVar4->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
    }
    dist_from_ideal_bucket = sVar3 + 1;
    ibucket = ibucket + 1 & (this->super_power_of_two_growth_policy<2UL>).m_mask;
  } while( true );
}

Assistant:

void insert_value_on_rehash(std::size_t ibucket,
                              distance_type dist_from_ideal_bucket,
                              truncated_hash_type hash, value_type&& value) {
    while (true) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (m_buckets[ibucket].empty()) {
          m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket,
                                                       hash, std::move(value));
          return;
        } else {
          m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                       hash, value);
        }
      }

      dist_from_ideal_bucket++;
      ibucket = next_bucket(ibucket);
    }
  }